

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void lodepng_color_profile_init(LodePNGColorProfile *profile)

{
  profile->alpha = 0;
  profile->numcolors = 0;
  profile->colored = 0;
  profile->key = 0;
  *(undefined8 *)((long)&profile->key + 2) = 0;
  profile->bits = 1;
  return;
}

Assistant:

void lodepng_color_profile_init(LodePNGColorProfile* profile)
{
	profile->colored = 0;
	profile->key = 0;
	profile->key_r = profile->key_g = profile->key_b = 0;
	profile->alpha = 0;
	profile->numcolors = 0;
	profile->bits = 1;
}